

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O0

void player_set_recall_depth(player *p)

{
  int16_t iVar1;
  _Bool _Var2;
  wchar_t wVar3;
  player *p_local;
  
  if (((((p->opts).opt[0x20] & 1U) != 0) && ((int)p->max_depth < (int)(z_info->max_depth - 1))) &&
     (_Var2 = is_quest(p,(int)p->max_depth), !_Var2)) {
    wVar3 = dungeon_get_next_level(p,(int)p->max_depth,L'\x01');
    p->recall_depth = (int16_t)wVar3;
  }
  if (p->recall_depth < 1) {
    iVar1 = 1;
  }
  else {
    iVar1 = p->recall_depth;
  }
  p->recall_depth = iVar1;
  return;
}

Assistant:

void player_set_recall_depth(struct player *p)
{
	/* Account for forced descent */
	if (OPT(p, birth_force_descend)) {
		/* Force descent to a lower level if allowed */
		if (p->max_depth < z_info->max_depth - 1
				&& !is_quest(p, p->max_depth)) {
			p->recall_depth = dungeon_get_next_level(p,
				p->max_depth, 1);
		}
	}

	/* Players who haven't left town before go to level 1 */
	p->recall_depth = MAX(p->recall_depth, 1);
}